

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O2

void __thiscall
CholeskyFactor::reduce(CholeskyFactor *this,QpVector *buffer_d,HighsInt maxabsd,bool p_in_v)

{
  double dVar1;
  uint uVar2;
  pointer pdVar3;
  pointer piVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  HighsInt i;
  int iVar6;
  int iVar7;
  HighsInt HVar8;
  int iVar9;
  ulong uVar10;
  pointer pdVar11;
  long lVar12;
  long lVar13;
  HighsInt col;
  long lVar14;
  vector<double,_std::allocator<double>_> row_p;
  allocator_type local_5d;
  undefined4 local_5c;
  QpVector *local_58;
  value_type_conflict1 local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  if (((long)this->current_k != 0) && (this->uptodate == true)) {
    local_5c = (undefined4)CONCAT71(in_register_00000009,p_in_v);
    this->numberofreduces = this->numberofreduces + 1;
    local_50 = 0.0;
    local_58 = buffer_d;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,(long)this->current_k,&local_50,
               &local_5d);
    uVar2 = this->current_k;
    iVar7 = this->current_k_max;
    pdVar11 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar10 = 0;
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    for (; uVar5 != uVar10; uVar10 = uVar10 + 1) {
      local_48._M_impl.super__Vector_impl_data._M_start[uVar10] =
           pdVar11[(uint)(iVar7 * maxabsd + (int)uVar10)];
    }
    lVar12 = (long)(int)uVar2 + -1;
    iVar7 = maxabsd + 1;
    HVar8 = maxabsd;
    while( true ) {
      iVar6 = this->current_k_max;
      pdVar11 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar9 = (int)lVar12;
      if (iVar9 <= HVar8) break;
      iVar9 = iVar6 * HVar8;
      HVar8 = HVar8 + 1;
      for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
        pdVar11[(long)iVar9 + uVar10] = pdVar11[(long)(iVar6 * iVar7) + uVar10];
      }
      iVar7 = iVar7 + 1;
    }
    for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
      pdVar11[(long)(iVar6 * iVar9) + uVar10] =
           local_48._M_impl.super__Vector_impl_data._M_start[uVar10];
    }
    iVar7 = this->current_k_max;
    pdVar3 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar11 = pdVar3 + 1;
    for (uVar10 = 0; uVar10 != uVar5; uVar10 = uVar10 + 1) {
      lVar13 = uVar10 * (long)iVar7;
      dVar1 = pdVar3[(uint)((int)lVar13 + maxabsd)];
      for (lVar14 = (long)maxabsd; lVar14 < lVar12; lVar14 = lVar14 + 1) {
        pdVar11[lVar14 + -1] = pdVar11[lVar14];
      }
      pdVar3[(long)(int)uVar2 + lVar13 + -1] = dVar1;
      pdVar11 = pdVar11 + iVar7;
    }
    iVar7 = 0;
    if (uVar2 != 1) {
      iVar7 = maxabsd;
      if ((char)local_5c == '\0') {
        while (0 < iVar7) {
          eliminate(this,&this->L,this->current_k + -1,iVar7 + -1,this->current_k_max,
                    this->current_k);
          iVar7 = iVar7 + -1;
        }
        piVar4 = (local_58->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar7 = this->current_k;
        iVar6 = (iVar7 + -1) * this->current_k_max;
        pdVar11 = (local_58->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar3 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = 0;
        uVar5 = (ulong)(uint)local_58->num_nz;
        if (local_58->num_nz < 1) {
          uVar5 = uVar10;
        }
        for (; uVar5 != uVar10; uVar10 = uVar10 + 1) {
          iVar9 = piVar4[uVar10];
          if (iVar9 != maxabsd) {
            lVar12 = (long)(iVar9 + iVar6);
            pdVar3[(ulong)(iVar9 < maxabsd) + lVar12 + -1] =
                 pdVar3[(ulong)(iVar9 < maxabsd) + lVar12 + -1] -
                 (pdVar11[iVar9] / pdVar11[maxabsd]) * pdVar3[(long)(iVar7 + iVar6) + -1];
          }
        }
      }
      iVar6 = 0;
      while( true ) {
        iVar7 = this->current_k + -1;
        if (iVar7 <= iVar6) break;
        eliminate(this,&this->L,iVar6,iVar7,this->current_k_max,this->current_k);
        iVar6 = iVar6 + 1;
      }
    }
    this->current_k = iVar7;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void reduce(const QpVector& buffer_d, const HighsInt maxabsd, bool p_in_v) {
    if (current_k == 0) {
      return;
    }
    if (!uptodate) {
      return;
    }
    numberofreduces++;

    unsigned p = maxabsd;  // col we push to the right and remove

    // start situation: p=3, current_k = 5
    // |1 x  | |x    |       |1   | |xxxxx|
    // | 1x  | |xx   |  ===  | 1  | | xxxx|
    // |  x1 | |xxx  |       |xxxx| |  xxx|
    // |  x 1| |xxxx |       |  1 | |   xx|
    //         |xxxxx|       |   1| |    x|
    // next step: move row/col p to the bottom/right

    //> save row p
    std::vector<double> row_p(current_k, 0.0);
    for (HighsInt i = 0; i < current_k; i++) {
      row_p[i] = L[p * current_k_max + i];
    }

    //> move all rows > p up by one row
    for (HighsInt row = p; row < current_k - 1; row++) {
      for (HighsInt i = 0; i < current_k; i++) {
        L[row * current_k_max + i] = L[(row + 1) * current_k_max + i];
      }
    }

    //> load row p
    for (HighsInt i = 0; i < current_k; i++) {
      L[(current_k - 1) * current_k_max + i] = row_p[i];
    }

    //> now move col p to the right in each row
    for (HighsInt row = 0; row < current_k; row++) {
      double p_entry = L[row * current_k_max + p];
      for (HighsInt col = p; col < current_k - 1; col++) {
        L[row * current_k_max + col] = L[row * current_k_max + col + 1];
      }
      L[row * current_k_max + current_k - 1] = p_entry;
    }

    if (current_k == 1) {
      current_k--;
      return;
    }

    if (!p_in_v) {
      // situation now:
      // |1   x| |x    |       |1   | |xxxxx|
      // | 1  x| |xx   |  ===  | 1  | | xxxx|
      // |  1 x| |xxx x|       |  1 | |  xx |
      // |   1x| |xxxxx|       |   1| |   x |
      //         |xx  x|       |xxxx| |  xxx|
      // next: remove nonzero entries in last column except for diagonal element
      for (HighsInt r = (HighsInt)p - 1; r >= 0; r--) {  // to current_k-1
        eliminate(L, current_k - 1, r, current_k_max, current_k);
      }

      // situation now:
      // |1   x| |x   x|        |xxxx | |1   |
      // | 1  x| |xx  x|  ===   | xxx | | 1  |
      // |  1 x| |xxx x|        |  xx | |  1 |
      // |   1x| |xxxxx|        |   x | |   1|
      //         |    x|        |xxxxx| |xxxx|
      // next: multiply product
      // new last row: old last row (first current_k-1 elements) + r *
      // R_current_k_current_k

      for (HighsInt i = 0; i < buffer_d.num_nz; i++) {
        HighsInt idx = buffer_d.index[i];
        if (idx == maxabsd) {
          continue;
        }
        if (idx < maxabsd) {
          L[(current_k - 1) * current_k_max + idx] +=
              -buffer_d.value[idx] / buffer_d.value[maxabsd] *
              L[(current_k - 1) * current_k_max + current_k - 1];
        } else {
          L[(current_k - 1) * current_k_max + idx - 1] +=
              -buffer_d.value[idx] / buffer_d.value[maxabsd] *
              L[(current_k - 1) * current_k_max + current_k - 1];
        }
      }
      // situation now: as above, but no more product
    }
    // next: eliminate last row
    for (HighsInt i = 0; i < current_k - 1; i++) {
      eliminate(L, i, current_k - 1, current_k_max, current_k);
    }
    current_k--;
  }